

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttsbit.c
# Opt level: O2

FT_Error tt_face_load_sbit(TT_Face face,FT_Stream stream)

{
  FT_Byte **pbytes;
  uint uVar1;
  uint *puVar2;
  TT_SbitTableType TVar3;
  ulong uVar4;
  FT_UShort FVar5;
  FT_Error FVar6;
  TT_SbitTableType TVar7;
  FT_ULong FVar8;
  FT_ULong FVar9;
  ulong uVar10;
  TT_SbitTableType TVar11;
  FT_UInt FVar12;
  FT_ULong table_size;
  FT_ULong local_48;
  FT_ULong ebdt_size;
  ulong local_38;
  
  pbytes = &face->sbit_table;
  face->sbit_table = (FT_Byte *)0x0;
  face->sbit_table_size = 0;
  face->sbit_table_type = TT_SBIT_TABLE_TYPE_NONE;
  face->sbit_num_strikes = 0;
  FVar6 = (*face->goto_table)(face,0x43424c43,stream,&table_size);
  TVar3 = TT_SBIT_TABLE_TYPE_SBIX;
  if (FVar6 == 0) {
    TVar11 = TT_SBIT_TABLE_TYPE_CBLC;
  }
  else {
    FVar6 = (*face->goto_table)(face,0x45424c43,stream,&table_size);
    TVar11 = TT_SBIT_TABLE_TYPE_EBLC;
    if (((FVar6 != 0) &&
        (FVar6 = (*face->goto_table)(face,0x626c6f63,stream,&table_size), FVar6 != 0)) &&
       (TVar7 = (*face->goto_table)(face,0x73626978,stream,&table_size), TVar11 = TVar3,
       TVar7 != TT_SBIT_TABLE_TYPE_NONE)) goto LAB_0015c3dc;
  }
  face->sbit_table_type = TVar11;
  TVar7 = TVar3;
  if (table_size < 8) goto LAB_0015c3dc;
  FVar8 = FT_Stream_Pos(stream);
  TVar11 = face->sbit_table_type;
  if (TVar11 - TT_SBIT_TABLE_TYPE_EBLC < 2) {
    TVar7 = FT_Stream_ExtractFrame(stream,table_size,pbytes);
    if (TVar7 != TT_SBIT_TABLE_TYPE_NONE) goto LAB_0015c3dc;
    face->sbit_table_size = table_size;
    puVar2 = (uint *)face->sbit_table;
    uVar1 = *puVar2;
    if ((((uVar1 & 0xff00) << 8 | uVar1 << 0x18 | 0x10000) == 0x30000) ||
       ((ushort)((ushort)(byte)(uVar1 >> 0x18) | (ushort)(uVar1 >> 8) & 0xff00 | 0x100) == 0x300)) {
      TVar7 = TVar3;
      if (*(char *)((long)puVar2 + 5) != '\0' || (char)puVar2[1] != '\0') goto LAB_0015c3dc;
      FVar12 = (FT_UInt)(ushort)(*(ushort *)((long)puVar2 + 6) << 8 |
                                *(ushort *)((long)puVar2 + 6) >> 8);
      if (table_size < (FVar12 * 0x30 | 8)) {
        FVar12 = (FT_UInt)((table_size - 8) / 0x30);
      }
LAB_0015c4e9:
      face->sbit_num_strikes = FVar12;
      TVar11 = face->sbit_table_type;
      goto LAB_0015c4f6;
    }
  }
  else {
    if (TVar11 != TT_SBIT_TABLE_TYPE_SBIX) {
LAB_0015c4f6:
      face->ebdt_start = 0;
      face->ebdt_size = 0;
      if (TVar11 == TT_SBIT_TABLE_TYPE_NONE) goto LAB_0015c598;
      if (TVar11 == TT_SBIT_TABLE_TYPE_SBIX) {
        face->ebdt_start = FVar8;
LAB_0015c586:
        face->ebdt_size = table_size;
      }
      else {
        FVar6 = (*face->goto_table)(face,0x43424454,stream,&ebdt_size);
        if (((FVar6 == 0) ||
            (FVar6 = (*face->goto_table)(face,0x45424454,stream,&ebdt_size), FVar6 == 0)) ||
           (FVar6 = (*face->goto_table)(face,0x62646174,stream,&ebdt_size), FVar6 == 0)) {
          FVar8 = FT_Stream_Pos(stream);
          face->ebdt_start = FVar8;
          table_size = ebdt_size;
          goto LAB_0015c586;
        }
        table_size = face->ebdt_size;
      }
      if (table_size != 0) {
        return 0;
      }
LAB_0015c598:
      face->sbit_num_strikes = 0;
      return 0;
    }
    TVar7 = FT_Stream_EnterFrame(stream,8);
    if (TVar7 != TT_SBIT_TABLE_TYPE_NONE) goto LAB_0015c3dc;
    FVar5 = FT_Stream_GetUShort(stream);
    local_48 = CONCAT62(local_48._2_6_,FVar5);
    FVar5 = FT_Stream_GetUShort(stream);
    local_38 = FT_Stream_GetULong(stream);
    FT_Stream_ExitFrame(stream);
    uVar10 = local_38;
    if ((short)local_48 != 0) {
      TVar7 = TVar3;
      if (0xffff < local_38 || (FVar5 & 0xfffd) != 1) goto LAB_0015c3dc;
      local_48 = table_size;
      FVar9 = FT_Stream_Pos(stream);
      TVar7 = FT_Stream_Seek(stream,FVar9 - 8);
      if (TVar7 != TT_SBIT_TABLE_TYPE_NONE) goto LAB_0015c3dc;
      uVar4 = local_48 + 0x3fffffff8 >> 2;
      if (uVar10 * 4 + 8 <= local_48) {
        uVar4 = uVar10;
      }
      FVar12 = (FT_UInt)uVar4;
      uVar10 = (ulong)(FVar12 * 4 + 8);
      face->sbit_table_size = uVar10;
      TVar7 = FT_Stream_ExtractFrame(stream,uVar10,pbytes);
      if (TVar7 != TT_SBIT_TABLE_TYPE_NONE) goto LAB_0015c3dc;
      goto LAB_0015c4e9;
    }
  }
  TVar7 = TT_SBIT_TABLE_TYPE_CBLC;
LAB_0015c3dc:
  if (*pbytes != (FT_Byte *)0x0) {
    FT_Stream_ReleaseFrame(stream,pbytes);
  }
  face->sbit_table_size = 0;
  face->sbit_table_type = TT_SBIT_TABLE_TYPE_NONE;
  return TVar7;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  tt_face_load_sbit( TT_Face    face,
                     FT_Stream  stream )
  {
    FT_Error  error;
    FT_ULong  table_size;
    FT_ULong  table_start;


    face->sbit_table       = NULL;
    face->sbit_table_size  = 0;
    face->sbit_table_type  = TT_SBIT_TABLE_TYPE_NONE;
    face->sbit_num_strikes = 0;

    error = face->goto_table( face, TTAG_CBLC, stream, &table_size );
    if ( !error )
      face->sbit_table_type = TT_SBIT_TABLE_TYPE_CBLC;
    else
    {
      error = face->goto_table( face, TTAG_EBLC, stream, &table_size );
      if ( error )
        error = face->goto_table( face, TTAG_bloc, stream, &table_size );
      if ( !error )
        face->sbit_table_type = TT_SBIT_TABLE_TYPE_EBLC;
    }

    if ( error )
    {
      error = face->goto_table( face, TTAG_sbix, stream, &table_size );
      if ( !error )
        face->sbit_table_type = TT_SBIT_TABLE_TYPE_SBIX;
    }
    if ( error )
      goto Exit;

    if ( table_size < 8 )
    {
      FT_ERROR(( "tt_face_load_sbit_strikes: table too short\n" ));
      error = FT_THROW( Invalid_File_Format );
      goto Exit;
    }

    table_start = FT_STREAM_POS();

    switch ( (FT_UInt)face->sbit_table_type )
    {
    case TT_SBIT_TABLE_TYPE_EBLC:
    case TT_SBIT_TABLE_TYPE_CBLC:
      {
        FT_Byte*  p;
        FT_Fixed  version;
        FT_ULong  num_strikes;
        FT_UInt   count;


        if ( FT_FRAME_EXTRACT( table_size, face->sbit_table ) )
          goto Exit;

        face->sbit_table_size = table_size;

        p = face->sbit_table;

        version     = FT_NEXT_LONG( p );
        num_strikes = FT_NEXT_ULONG( p );

        /* there's at least one font (FZShuSong-Z01, version 3)   */
        /* that uses the wrong byte order for the `version' field */
        if ( ( (FT_ULong)version & 0xFFFF0000UL ) != 0x00020000UL &&
             ( (FT_ULong)version & 0x0000FFFFUL ) != 0x00000200UL &&
             ( (FT_ULong)version & 0xFFFF0000UL ) != 0x00030000UL &&
             ( (FT_ULong)version & 0x0000FFFFUL ) != 0x00000300UL )
        {
          error = FT_THROW( Unknown_File_Format );
          goto Exit;
        }

        if ( num_strikes >= 0x10000UL )
        {
          error = FT_THROW( Invalid_File_Format );
          goto Exit;
        }

        /*
         *  Count the number of strikes available in the table.  We are a bit
         *  paranoid there and don't trust the data.
         */
        count = (FT_UInt)num_strikes;
        if ( 8 + 48UL * count > table_size )
          count = (FT_UInt)( ( table_size - 8 ) / 48 );

        face->sbit_num_strikes = count;
      }
      break;

    case TT_SBIT_TABLE_TYPE_SBIX:
      {
        FT_UShort  version;
        FT_UShort  flags;
        FT_ULong   num_strikes;
        FT_UInt    count;


        if ( FT_FRAME_ENTER( 8 ) )
          goto Exit;

        version     = FT_GET_USHORT();
        flags       = FT_GET_USHORT();
        num_strikes = FT_GET_ULONG();

        FT_FRAME_EXIT();

        if ( version < 1 )
        {
          error = FT_THROW( Unknown_File_Format );
          goto Exit;
        }

        /* Bit 0 must always be `1'.                            */
        /* Bit 1 controls the overlay of bitmaps with outlines. */
        /* All other bits should be zero.                       */
        if ( !( flags == 1 || flags == 3 ) ||
             num_strikes >= 0x10000UL      )
        {
          error = FT_THROW( Invalid_File_Format );
          goto Exit;
        }

        /* we currently don't support bit 1; however, it is better to */
        /* draw at least something...                                 */
        if ( flags == 3 )
          FT_TRACE1(( "tt_face_load_sbit_strikes:"
                      " sbix overlay not supported yet\n"
                      "                          "
                      " expect bad rendering results\n" ));

        /*
         *  Count the number of strikes available in the table.  We are a bit
         *  paranoid there and don't trust the data.
         */
        count = (FT_UInt)num_strikes;
        if ( 8 + 4UL * count > table_size )
          count = (FT_UInt)( ( table_size - 8 ) / 4 );

        if ( FT_STREAM_SEEK( FT_STREAM_POS() - 8 ) )
          goto Exit;

        face->sbit_table_size = 8 + count * 4;
        if ( FT_FRAME_EXTRACT( face->sbit_table_size, face->sbit_table ) )
          goto Exit;

        face->sbit_num_strikes = count;
      }
      break;

    default:
      /* we ignore unknown table formats */
      error = FT_THROW( Unknown_File_Format );
      break;
    }

    if ( !error )
      FT_TRACE3(( "tt_face_load_sbit_strikes: found %u strikes\n",
                  face->sbit_num_strikes ));

    face->ebdt_start = 0;
    face->ebdt_size  = 0;

    if ( face->sbit_table_type == TT_SBIT_TABLE_TYPE_SBIX )
    {
      /* the `sbix' table is self-contained; */
      /* it has no associated data table     */
      face->ebdt_start = table_start;
      face->ebdt_size  = table_size;
    }
    else if ( face->sbit_table_type != TT_SBIT_TABLE_TYPE_NONE )
    {
      FT_ULong  ebdt_size;


      error = face->goto_table( face, TTAG_CBDT, stream, &ebdt_size );
      if ( error )
        error = face->goto_table( face, TTAG_EBDT, stream, &ebdt_size );
      if ( error )
        error = face->goto_table( face, TTAG_bdat, stream, &ebdt_size );

      if ( !error )
      {
        face->ebdt_start = FT_STREAM_POS();
        face->ebdt_size  = ebdt_size;
      }
    }

    if ( !face->ebdt_size )
    {
      FT_TRACE2(( "tt_face_load_sbit_strikes:"
                  " no embedded bitmap data table found;\n"
                  "                          "
                  " resetting number of strikes to zero\n" ));
      face->sbit_num_strikes = 0;
    }

    return FT_Err_Ok;

  Exit:
    if ( error )
    {
      if ( face->sbit_table )
        FT_FRAME_RELEASE( face->sbit_table );
      face->sbit_table_size = 0;
      face->sbit_table_type = TT_SBIT_TABLE_TYPE_NONE;
    }

    return error;
  }